

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

void PPC_printInst(MCInst *MI,SStream *O,void *Info)

{
  cs_detail *pcVar1;
  bool bVar2;
  _Bool _Var3;
  uint uVar4;
  int iVar5;
  MCOperand *pMVar6;
  int64_t iVar7;
  int64_t iVar8;
  uint8_t *puVar9;
  uint64_t uVar10;
  size_t sVar11;
  SStream *in_RSI;
  MCInst *in_RDI;
  ppc_alias alias;
  int64_t bd_2;
  int64_t bd_1;
  int64_t bd;
  uchar ME_1;
  uchar SH_1;
  cs_ppc *ppc;
  _Bool useSubstituteMnemonic;
  uchar ME;
  uchar MB;
  uchar SH;
  char *mnem;
  void *in_stack_00000208;
  SStream *in_stack_00000210;
  MCInst *in_stack_00000218;
  void *in_stack_00000c58;
  SStream *in_stack_00000c60;
  MCInst *in_stack_00000c68;
  char *in_stack_ffffffffffffff78;
  SStream *pSVar12;
  SStream *in_stack_ffffffffffffff80;
  SStream *in_stack_ffffffffffffff88;
  SStream *in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  MCRegisterInfo *in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffc8;
  byte in_stack_ffffffffffffffce;
  byte in_stack_ffffffffffffffcf;
  MCInst *in_stack_ffffffffffffffd0;
  byte local_21;
  SStream *local_20;
  
  uVar4 = MCInst_getOpcode(in_RDI);
  if (uVar4 == 0x3d2) {
    pMVar6 = MCInst_getOperand(in_RDI,2);
    iVar7 = MCOperand_getImm(pMVar6);
    local_21 = (byte)iVar7;
    pMVar6 = MCInst_getOperand(in_RDI,3);
    iVar7 = MCOperand_getImm(pMVar6);
    pMVar6 = MCInst_getOperand(in_RDI,4);
    iVar8 = MCOperand_getImm(pMVar6);
    bVar2 = false;
    if (((local_21 < 0x20) && ((byte)iVar7 == 0)) && ((uint)(byte)iVar8 == 0x1f - local_21)) {
      SStream_concat0(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      MCInst_setOpcodePub(in_RDI,0x3a5);
      bVar2 = true;
    }
    if (((local_21 < 0x20) && ((uint)(byte)iVar7 == 0x20 - local_21)) && ((byte)iVar8 == 0x1f)) {
      SStream_concat0(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      MCInst_setOpcodePub(in_RDI,0x3a6);
      bVar2 = true;
      local_21 = 0x20 - local_21;
    }
    if (bVar2) {
      printOperand((MCInst *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
      SStream_concat0(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      printOperand((MCInst *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
      if (local_21 < 10) {
        SStream_concat(in_RSI,", %u",(ulong)local_21);
      }
      else {
        SStream_concat(in_RSI,", 0x%x",(ulong)local_21);
      }
      if (in_RDI->csh->detail == CS_OPT_OFF) {
        return;
      }
      pcVar1 = in_RDI->flat_insn->detail;
      puVar9 = pcVar1->groups + (ulong)(pcVar1->field_6).x86.addr_size * 0x18 + 0x1d;
      puVar9[0] = '\x02';
      puVar9[1] = '\0';
      puVar9[2] = '\0';
      puVar9[3] = '\0';
      *(ulong *)(pcVar1->groups + (ulong)(pcVar1->field_6).x86.addr_size * 0x18 + 0x25) =
           (ulong)local_21;
      (pcVar1->field_6).x86.addr_size = (pcVar1->field_6).x86.addr_size + '\x01';
      return;
    }
  }
  uVar4 = MCInst_getOpcode(in_RDI);
  if ((uVar4 == 0x302) || (uVar4 = MCInst_getOpcode(in_RDI), uVar4 == 0x303)) {
    pMVar6 = MCInst_getOperand(in_RDI,1);
    in_stack_ffffffffffffff9c = MCOperand_getReg(pMVar6);
    pMVar6 = MCInst_getOperand(in_RDI,2);
    uVar4 = MCOperand_getReg(pMVar6);
    if (in_stack_ffffffffffffff9c == uVar4) {
      SStream_concat0(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      MCInst_setOpcodePub(in_RDI,0x3f0);
      printOperand((MCInst *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
      SStream_concat0(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      printOperand((MCInst *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
      return;
    }
  }
  uVar4 = MCInst_getOpcode(in_RDI);
  if (uVar4 == 0x3c9) {
    pMVar6 = MCInst_getOperand(in_RDI,2);
    iVar7 = MCOperand_getImm(pMVar6);
    in_stack_ffffffffffffffcf = (byte)iVar7;
    pMVar6 = MCInst_getOperand(in_RDI,3);
    iVar7 = MCOperand_getImm(pMVar6);
    in_stack_ffffffffffffffce = (byte)iVar7;
    if (0x3f - in_stack_ffffffffffffffcf == (uint)in_stack_ffffffffffffffce) {
      SStream_concat0(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      MCInst_setOpcodePub(in_RDI,0x3a7);
      printOperand((MCInst *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
      SStream_concat0(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      printOperand((MCInst *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
      if (9 < in_stack_ffffffffffffffcf) {
        SStream_concat(in_RSI,", 0x%x",(ulong)in_stack_ffffffffffffffcf);
        return;
      }
      SStream_concat(in_RSI,", %u",(ulong)in_stack_ffffffffffffffcf);
      return;
    }
  }
  uVar4 = MCInst_getOpcode(in_RDI);
  if ((((uVar4 == 0x5e6) || (uVar4 = MCInst_getOpcode(in_RDI), uVar4 == 0x5e7)) ||
      (uVar4 = MCInst_getOpcode(in_RDI), uVar4 == 0x5ea)) ||
     (uVar4 = MCInst_getOpcode(in_RDI), uVar4 == 0x5eb)) {
    pMVar6 = MCInst_getOperand(in_RDI,2);
    uVar10 = MCOperand_getImm(pMVar6);
    in_stack_ffffffffffffffc0 = (MCRegisterInfo *)SignExtend64(uVar10,0xe);
    pMVar6 = MCInst_getOperand(in_RDI,2);
    MCOperand_setImm(pMVar6,(int64_t)in_stack_ffffffffffffffc0);
  }
  uVar4 = MCInst_getOpcode(in_RDI);
  iVar5 = isBOCTRBranch(uVar4);
  if (iVar5 != 0) {
    pMVar6 = MCInst_getOperand(in_RDI,0);
    _Var3 = MCOperand_isImm(pMVar6);
    if (_Var3) {
      pMVar6 = MCInst_getOperand(in_RDI,0);
      uVar10 = MCOperand_getImm(pMVar6);
      iVar7 = SignExtend64(uVar10,0xe);
      pMVar6 = MCInst_getOperand(in_RDI,0);
      MCOperand_setImm(pMVar6,iVar7);
    }
  }
  uVar4 = MCInst_getOpcode(in_RDI);
  if (((uVar4 == 0x78) || (uVar4 = MCInst_getOpcode(in_RDI), uVar4 == 0x79)) ||
     ((uVar4 = MCInst_getOpcode(in_RDI), uVar4 == 0xc2 ||
      (uVar4 = MCInst_getOpcode(in_RDI), uVar4 == 200)))) {
    pMVar6 = MCInst_getOperand(in_RDI,0);
    uVar10 = MCOperand_getImm(pMVar6);
    iVar7 = SignExtend64(uVar10,0x18);
    pMVar6 = MCInst_getOperand(in_RDI,0);
    MCOperand_setImm(pMVar6,iVar7);
  }
  local_20 = (SStream *)printAliasInstrEx(in_stack_00000218,in_stack_00000210,in_stack_00000208);
  if (local_20 == (SStream *)0x0) {
    local_20 = (SStream *)printAliasInstr(in_stack_00000c68,in_stack_00000c60,in_stack_00000c58);
  }
  if (local_20 == (SStream *)0x0) {
    printInstruction(in_stack_ffffffffffffffd0,
                     (SStream *)
                     CONCAT17(in_stack_ffffffffffffffcf,
                              CONCAT16(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8)),
                     in_stack_ffffffffffffffc0);
  }
  else {
    sVar11 = strlen(local_20->buffer);
    if (sVar11 != 0) {
      pSVar12 = local_20;
      sVar11 = strlen(local_20->buffer);
      if (((pSVar12->buffer[sVar11 - 1] == '-') ||
          (in_stack_ffffffffffffff88 = local_20, sVar11 = strlen(local_20->buffer),
          in_stack_ffffffffffffff88->buffer[sVar11 - 1] == '+')) ||
         (in_stack_ffffffffffffff80 = local_20, sVar11 = strlen(local_20->buffer),
         in_stack_ffffffffffffff80->buffer[sVar11 - 1] == '.')) {
        pSVar12 = local_20;
        sVar11 = strlen(local_20->buffer);
        pSVar12->buffer[sVar11 - 1] = '\0';
      }
      _Var3 = PPC_alias_insn(in_stack_ffffffffffffff88->buffer,
                             (ppc_alias *)in_stack_ffffffffffffff80);
      if ((_Var3) &&
         (MCInst_setOpcodePub(in_RDI,in_stack_ffffffffffffffa0), in_RDI->csh->detail != CS_OPT_OFF))
      {
        *(undefined4 *)(in_RDI->flat_insn->detail->field_6).x86.prefix = in_stack_ffffffffffffffa4;
      }
    }
    (*cs_mem_free)(local_20);
  }
  return;
}

Assistant:

void PPC_printInst(MCInst *MI, SStream *O, void *Info)
{
	char *mnem;

	// Check for slwi/srwi mnemonics.
	if (MCInst_getOpcode(MI) == PPC_RLWINM) {
		unsigned char SH = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 2));
		unsigned char MB = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 3));
		unsigned char ME = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 4));
		bool useSubstituteMnemonic = false;

		if (SH <= 31 && MB == 0 && ME == (31-SH)) {
			SStream_concat0(O, "slwi\t");
			MCInst_setOpcodePub(MI, PPC_INS_SLWI);
			useSubstituteMnemonic = true;
		}

		if (SH <= 31 && MB == (32-SH) && ME == 31) {
			SStream_concat0(O, "srwi\t");
			MCInst_setOpcodePub(MI, PPC_INS_SRWI);
			useSubstituteMnemonic = true;
			SH = 32-SH;
		}

		if (useSubstituteMnemonic) {
			printOperand(MI, 0, O);
			SStream_concat0(O, ", ");
			printOperand(MI, 1, O);
			if (SH > HEX_THRESHOLD)
				SStream_concat(O, ", 0x%x", (unsigned int)SH);
			else
				SStream_concat(O, ", %u", (unsigned int)SH);

			if (MI->csh->detail) {
				cs_ppc *ppc = &MI->flat_insn->detail->ppc;

				ppc->operands[ppc->op_count].type = PPC_OP_IMM;
				ppc->operands[ppc->op_count].imm = SH;
				++ppc->op_count;
			}

			return;
		}
	}

	if ((MCInst_getOpcode(MI) == PPC_OR || MCInst_getOpcode(MI) == PPC_OR8) &&
			MCOperand_getReg(MCInst_getOperand(MI, 1)) == MCOperand_getReg(MCInst_getOperand(MI, 2))) {
		SStream_concat0(O, "mr\t");
		MCInst_setOpcodePub(MI, PPC_INS_MR);
		printOperand(MI, 0, O);
		SStream_concat0(O, ", ");
		printOperand(MI, 1, O);
		return;
	}

	if (MCInst_getOpcode(MI) == PPC_RLDICR) {
		unsigned char SH = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 2));
		unsigned char ME = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 3));
		// rldicr RA, RS, SH, 63-SH == sldi RA, RS, SH
		if (63-SH == ME) {
			SStream_concat0(O, "sldi\t");
			MCInst_setOpcodePub(MI, PPC_INS_SLDI);
			printOperand(MI, 0, O);
			SStream_concat0(O, ", ");
			printOperand(MI, 1, O);
			if (SH > HEX_THRESHOLD)
				SStream_concat(O, ", 0x%x", (unsigned int)SH);
			else
				SStream_concat(O, ", %u", (unsigned int)SH);

			return;
		}
	}

	if ((MCInst_getOpcode(MI) == PPC_gBC)||(MCInst_getOpcode(MI) == PPC_gBCA)||
			(MCInst_getOpcode(MI) == PPC_gBCL)||(MCInst_getOpcode(MI) == PPC_gBCLA)) {
		int64_t bd = MCOperand_getImm(MCInst_getOperand(MI, 2));
		bd = SignExtend64(bd, 14);
		MCOperand_setImm(MCInst_getOperand(MI, 2),bd);
	}

	if (isBOCTRBranch(MCInst_getOpcode(MI))) {
		if (MCOperand_isImm(MCInst_getOperand(MI,0)))
		{
			int64_t bd = MCOperand_getImm(MCInst_getOperand(MI, 0));
			bd = SignExtend64(bd, 14);
			MCOperand_setImm(MCInst_getOperand(MI, 0),bd);
		}
	}

	if ((MCInst_getOpcode(MI) == PPC_B)||(MCInst_getOpcode(MI) == PPC_BA)||
			(MCInst_getOpcode(MI) == PPC_BL)||(MCInst_getOpcode(MI) == PPC_BLA)) {
		int64_t bd = MCOperand_getImm(MCInst_getOperand(MI, 0));
		bd = SignExtend64(bd, 24);
		MCOperand_setImm(MCInst_getOperand(MI, 0),bd);
	}

	// consider our own alias instructions first
	mnem = printAliasInstrEx(MI, O, Info);
	if (!mnem)
		mnem = printAliasInstr(MI, O, Info);

	if (mnem != NULL) {
		if (strlen(mnem) > 0) {
			struct ppc_alias alias;
			// check to remove the last letter of ('.', '-', '+')
			if (mnem[strlen(mnem) - 1] == '-' || mnem[strlen(mnem) - 1] == '+' || mnem[strlen(mnem) - 1] == '.')
				mnem[strlen(mnem) - 1] = '\0';

			if (PPC_alias_insn(mnem, &alias)) {
				MCInst_setOpcodePub(MI, alias.id);
				if (MI->csh->detail) {
					MI->flat_insn->detail->ppc.bc = (ppc_bc)alias.cc;
				}
			}
		}

		cs_mem_free(mnem);
	} else
		printInstruction(MI, O, NULL);
}